

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O1

void * embree::alignedUSMMalloc(size_t size,size_t align,EmbreeUSMMode mode)

{
  int iVar1;
  void *in_RAX;
  size_t __alignment;
  undefined8 *puVar2;
  void *pvStack_8;
  
  if (size == 0) {
    pvStack_8 = (void *)0x0;
  }
  else {
    if (align == 1) {
      pvStack_8 = malloc(size);
    }
    else {
      __alignment = 8;
      if (8 < align) {
        __alignment = align;
      }
      if ((align & align - 1) != 0) {
        __alignment = align;
      }
      pvStack_8 = in_RAX;
      iVar1 = posix_memalign(&pvStack_8,__alignment,size);
      if (iVar1 != 0) {
        pvStack_8 = (void *)0x0;
      }
    }
    if (pvStack_8 == (void *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = rtcSetGeometryTimeRange;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return pvStack_8;
}

Assistant:

void* alignedUSMMalloc(size_t size, size_t align, EmbreeUSMMode mode)
  {
#if defined(EMBREE_SYCL_SUPPORT)
    if (tls_context)
      return alignedSYCLMalloc(tls_context,tls_device,size,align,mode);
    else
#endif
      return alignedMalloc(size,align);
  }